

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_TagBox.cpp
# Opt level: O3

void __thiscall
amrex::TagBoxArray::TagBoxArray(TagBoxArray *this,BoxArray *ba,DistributionMapping *dm,int _ngrow)

{
  FabFactory<amrex::TagBox> local_50;
  IntVect local_44;
  MFInfo local_38;
  
  local_38.alloc = true;
  local_38._1_7_ = 0;
  local_38.arena = (Arena *)0x0;
  local_38.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50._vptr_FabFactory = (_func_int **)&PTR__FabFactory_0080d978;
  local_44.vect[0] = _ngrow;
  local_44.vect[1] = _ngrow;
  local_44.vect[2] = _ngrow;
  FabArray<amrex::TagBox>::FabArray
            (&this->super_FabArray<amrex::TagBox>,ba,dm,1,&local_44,&local_38,&local_50);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38.tags.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  (this->super_FabArray<amrex::TagBox>).super_FabArrayBase._vptr_FabArrayBase =
       (_func_int **)&PTR__FabArray_0080d8b8;
  FabArray<amrex::TagBox>::setVal<amrex::TagBox,_0>
            (&this->super_FabArray<amrex::TagBox>,'\0',0,
             (this->super_FabArray<amrex::TagBox>).super_FabArrayBase.n_comp,
             &(this->super_FabArray<amrex::TagBox>).super_FabArrayBase.n_grow);
  return;
}

Assistant:

TagBoxArray::TagBoxArray (const BoxArray& ba,
                          const DistributionMapping& dm,
                          int             _ngrow)
    :
    FabArray<TagBox>(ba,dm,1,_ngrow,MFInfo(),DefaultFabFactory<TagBox>())
{
    setVal(TagBox::CLEAR);
}